

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::CanonicalIterator::next(UnicodeString *__return_storage_ptr__,CanonicalIterator *this)

{
  UnicodeString *this_00;
  ushort uVar1;
  short sVar2;
  int iVar3;
  UnicodeString *pUVar4;
  int32_t *piVar5;
  int32_t *piVar6;
  ushort uVar7;
  ulong uVar8;
  int32_t srcLength;
  long lVar9;
  
  this_00 = &this->buffer;
  if (this->done == '\0') {
    uVar1 = (this->buffer).fUnion.fStackFields.fLengthAndFlags;
    uVar7 = 2;
    if ((uVar1 & 1) == 0) {
      uVar7 = uVar1 & 0x1e;
    }
    (this->buffer).fUnion.fStackFields.fLengthAndFlags = uVar7;
    if (0 < this->pieces_length) {
      lVar9 = 0;
      do {
        pUVar4 = this->pieces[lVar9];
        iVar3 = this->current[lVar9];
        sVar2 = pUVar4[iVar3].fUnion.fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          srcLength = pUVar4[iVar3].fUnion.fFields.fLength;
        }
        else {
          srcLength = (int)sVar2 >> 5;
        }
        UnicodeString::doAppend(this_00,pUVar4 + iVar3,0,srcLength);
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->pieces_length);
    }
    if (0 < (long)this->current_length) {
      piVar5 = this->pieces_lengths;
      piVar6 = this->current;
      uVar8 = (long)this->current_length + 1;
      do {
        iVar3 = piVar6[uVar8 - 2];
        piVar6[uVar8 - 2] = iVar3 + 1;
        if (iVar3 + 1 < piVar5[uVar8 - 2]) goto LAB_0028f0d9;
        piVar6[uVar8 - 2] = 0;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    this->done = '\x01';
  }
  else {
    UnicodeString::setToBogus(this_00);
  }
LAB_0028f0d9:
  UnicodeString::UnicodeString(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CanonicalIterator::next() {
    int32_t i = 0;

    if (done) {
      buffer.setToBogus();
      return buffer;
    }

    // delete old contents
    buffer.remove();

    // construct return value

    for (i = 0; i < pieces_length; ++i) {
        buffer.append(pieces[i][current[i]]);
    }
    //String result = buffer.toString(); // not needed

    // find next value for next time

    for (i = current_length - 1; ; --i) {
        if (i < 0) {
            done = TRUE;
            break;
        }
        current[i]++;
        if (current[i] < pieces_lengths[i]) break; // got sequence
        current[i] = 0;
    }
    return buffer;
}